

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O2

void __thiscall CGL::GLScene::Scene::update_selection(Scene *this,Vector2D *p,Matrix4x4 *worldTo3DH)

{
  pointer ppSVar1;
  uint uVar2;
  pointer ppSVar3;
  long lVar4;
  int i;
  ulong uVar5;
  iterator __begin3;
  ulong uVar6;
  double dVar7;
  undefined1 auVar8 [64];
  uint local_3c;
  
  auVar8 = ZEXT1664(ZEXT816(0xbff0000000000000));
  local_3c = 0xffffffff;
  uVar5 = 0;
  while( true ) {
    ppSVar3 = (this->objects).
              super__Vector_base<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppSVar1 = (this->objects).
              super__Vector_base<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)((long)ppSVar1 - (long)ppSVar3 >> 3) <= uVar5) break;
    dVar7 = auVar8._0_8_;
    (*ppSVar3[uVar5]->_vptr_SceneObject[4])(ppSVar3[uVar5],p,worldTo3DH);
    if (0.0 <= auVar8._0_8_) {
      uVar2 = (uint)uVar5;
      if (dVar7 <= auVar8._0_8_ && -1 < (int)local_3c) {
        auVar8 = ZEXT864((ulong)dVar7);
        uVar2 = local_3c;
      }
    }
    else {
      auVar8 = ZEXT864((ulong)dVar7);
      uVar2 = local_3c;
    }
    local_3c = uVar2;
    uVar5 = uVar5 + 1;
  }
  if (local_3c == 0xffffffff) {
    for (; ppSVar3 != ppSVar1; ppSVar3 = ppSVar3 + 1) {
      (*(*ppSVar3)->_vptr_SceneObject[7])();
    }
  }
  else {
    uVar5 = 0;
    uVar6 = 0;
    if (0 < (int)local_3c) {
      uVar6 = (ulong)local_3c;
    }
    for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
      (*(this->objects).
        super__Vector_base<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar5]->_vptr_SceneObject[7])();
    }
    uVar6 = (ulong)(int)local_3c;
    ppSVar3 = (this->objects).
              super__Vector_base<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_>
              ._M_impl.super__Vector_impl_data._M_start + uVar6;
    lVar4 = 0x28;
    uVar5 = uVar6;
    while( true ) {
      uVar5 = uVar5 + 1;
      (**(code **)((long)(*ppSVar3)->_vptr_SceneObject + lVar4))();
      ppSVar3 = (this->objects).
                super__Vector_base<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->objects).
                        super__Vector_base<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar3 >> 3) <= uVar5)
      break;
      uVar6 = uVar6 + 1;
      ppSVar3 = ppSVar3 + uVar6;
      lVar4 = 0x38;
    }
  }
  this->hoverIdx = local_3c;
  return;
}

Assistant:

void Scene::update_selection(const Vector2D& p, const Matrix4x4& worldTo3DH) {
  double minW = -1.0;
  int minI = -1;
  for (int i = 0; i < objects.size(); i++) {
    double newW = objects[i]->test_selection(p, worldTo3DH, minW);
    if (newW >= 0.0 && (minI < 0 || newW < minW)) {
      minI = i;
      minW = newW;
    }
  }
  if (minI == -1) {
    for (SceneObject *obj : objects) {
      obj->invalidate_hover();
    }
  } else {
    for (int i = 0; i < minI; i++) {
      objects[i]->invalidate_hover();
    }
    objects[minI]->confirm_hover();
    for (int i = minI + 1; i < objects.size(); i++) {
      objects[i]->invalidate_hover();
    }
  }
  hoverIdx = minI;
}